

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

int run_test_fs_poll_getpath(void)

{
  int iVar1;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  size_t len;
  char buf [1024];
  
  loop = uv_default_loop();
  remove("testfile");
  iVar1 = uv_fs_poll_init(loop,&poll_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xb3,"uv_fs_poll_init(loop, &poll_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  eval_a = 0x400;
  iVar1 = uv_fs_poll_getpath(&poll_handle,(char *)&len,(size_t *)&eval_a);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xb5,"UV_EINVAL","==","uv_fs_poll_getpath(&poll_handle, buf, &len)",0xffffffffffffffea,
            "==",(long)iVar1);
    abort();
  }
  iVar1 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xb6,"uv_fs_poll_start(&poll_handle, poll_cb_fail, \"testfile\", 100)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  eval_a = 0x400;
  iVar1 = uv_fs_poll_getpath(&poll_handle,(char *)&len,(size_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xb8,"uv_fs_poll_getpath(&poll_handle, buf, &len)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (*(char *)((long)&eval_a + eval_a + 7) == '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xb9,"0","!=","buf[len - 1]",0,"!=",0);
    abort();
  }
  if ((long)buf[eval_a + -8] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xba,"buf[len]","==","\'\\0\'",(long)buf[eval_a + -8],"==",0);
    abort();
  }
  iVar1 = memcmp(&len,"testfile",eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xbb,"memcmp(buf, \"testfile\", len)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)&poll_handle,close_cb);
  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xbf,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xc1,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  close_loop(loop);
  iVar1 = uv_loop_close(loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xc3,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_poll_getpath) {
  char buf[1024];
  size_t len;
  loop = uv_default_loop();

  remove(FIXTURE);

  ASSERT_OK(uv_fs_poll_init(loop, &poll_handle));
  len = sizeof buf;
  ASSERT_EQ(UV_EINVAL, uv_fs_poll_getpath(&poll_handle, buf, &len));
  ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  len = sizeof buf;
  ASSERT_OK(uv_fs_poll_getpath(&poll_handle, buf, &len));
  ASSERT_NE(0, buf[len - 1]);
  ASSERT_EQ(buf[len], '\0');
  ASSERT_OK(memcmp(buf, FIXTURE, len));

  uv_close((uv_handle_t*) &poll_handle, close_cb);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}